

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O3

bool __thiscall jrtplib::RTPSources::GotoPreviousSourceWithData(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  HashElement *pHVar2;
  
  pHVar2 = (this->sourcelist).curhashelem;
  if (pHVar2 != (HashElement *)0x0) {
    pHVar2 = pHVar2->listprev;
    while( true ) {
      (this->sourcelist).curhashelem = pHVar2;
LAB_0011e62d:
      if ((pHVar2 == (HashElement *)0x0) ||
         ((pRVar1 = pHVar2->element, (pRVar1->super_RTPSourceData).validated == true &&
          ((pRVar1->super_RTPSourceData).packetlist.
           super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next !=
           (_List_node_base *)&(pRVar1->super_RTPSourceData).packetlist)))) break;
      pHVar2 = pHVar2->listprev;
    }
    return pHVar2 != (HashElement *)0x0;
  }
  pHVar2 = (HashElement *)0x0;
  goto LAB_0011e62d;
}

Assistant:

inline void RTPKeyHashTable<Key,Element,GetIndex,hashsize>::GotoPreviousElement()
{
	if (curhashelem)
		curhashelem = curhashelem->listprev;
}